

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_impl.cc
# Opt level: O0

Impl * absl::time_internal::cctz::time_zone::Impl::UTCImpl(void)

{
  int iVar1;
  Impl *this;
  allocator<char> local_39;
  string local_38 [24];
  undefined8 in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  if (UTCImpl()::utc_impl == '\0') {
    iVar1 = __cxa_guard_acquire(&UTCImpl()::utc_impl);
    if (iVar1 != 0) {
      this = (Impl *)operator_new(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
                 (allocator<char> *)in_stack_ffffffffffffffe0);
      Impl(this,(string *)local_38);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator(&local_39);
      UTCImpl::utc_impl = this;
      __cxa_guard_release(&UTCImpl()::utc_impl);
    }
  }
  return UTCImpl::utc_impl;
}

Assistant:

const time_zone::Impl* time_zone::Impl::UTCImpl() {
  static const Impl* utc_impl = new Impl("UTC");  // never fails
  return utc_impl;
}